

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int makeSorterRecord(Parse *pParse,SortCtx *pSort,Select *pSelect,int regBase,int nBase)

{
  int iVar1;
  Vdbe *p;
  int p3;
  
  iVar1 = pSort->nOBSat;
  p = pParse->pVdbe;
  p3 = pParse->nMem + 1;
  pParse->nMem = p3;
  if (pSort->pDeferredRowLoad != (RowLoadInfo *)0x0) {
    innerLoopLoadRow(pParse,pSelect,pSort->pDeferredRowLoad);
  }
  sqlite3VdbeAddOp3(p,0x5c,regBase + iVar1,nBase - iVar1,p3);
  return p3;
}

Assistant:

static int makeSorterRecord(
  Parse *pParse,
  SortCtx *pSort,
  Select *pSelect,
  int regBase,
  int nBase
){
  int nOBSat = pSort->nOBSat;
  Vdbe *v = pParse->pVdbe;
  int regOut = ++pParse->nMem;
  if( pSort->pDeferredRowLoad ){
    innerLoopLoadRow(pParse, pSelect, pSort->pDeferredRowLoad);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase+nOBSat, nBase-nOBSat, regOut);
  return regOut;
}